

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_FFDHE.c
# Opt level: O1

uint64_t Hacl_FFDHE_ffdhe_shared_secret(Spec_FFDHE_ffdhe_alg a,uint8_t *sk,uint8_t *pk,uint8_t *ss)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  uint64_t uVar4;
  ulong *puVar5;
  void *pvVar6;
  void *extraout_RDX;
  ulong __n;
  uint uVar7;
  undefined7 in_register_00000039;
  ulong uVar8;
  uint64_t *p_r2_n;
  ulong *__s;
  bool bVar9;
  undefined8 uStack_78;
  void *pvStack_70;
  code *pcStack_40;
  uint64_t uStack_38;
  
  uVar7 = (uint)CONCAT71(in_register_00000039,a);
  if (a < 5) {
    lVar1 = *(long *)(&DAT_001e4c88 + (ulong)a * 8);
    lVar3 = -(lVar1 * 8 + 0xfU & 0xfffffffffffffff0);
    p_r2_n = (uint64_t *)((long)&uStack_38 + lVar3);
    *(undefined8 *)((long)&pcStack_40 + lVar3) = 0x163cf8;
    memset(p_r2_n,0,lVar1 << 3);
    *(undefined8 *)((long)&pcStack_40 + lVar3) = 0x163d03;
    ffdhe_precomp_p(a,p_r2_n);
    *(undefined8 *)((long)&pcStack_40 + lVar3) = 0x163d17;
    uVar4 = Hacl_FFDHE_ffdhe_shared_secret_precomp(a,p_r2_n,sk,pk,ss);
    return uVar4;
  }
  pcStack_40 = Hacl_Bignum_Convert_bn_to_bytes_be_uint64;
  Hacl_FFDHE_ffdhe_shared_secret_cold_1();
  __n = (ulong)((uVar7 - 1 & 0xfffffff8) + 8);
  lVar1 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = (ulong *)((long)&pvStack_70 + lVar1);
  pvStack_70 = extraout_RDX;
  pcStack_40 = (code *)&stack0xfffffffffffffff8;
  *(undefined8 *)((long)&uStack_78 + lVar1) = 0x163d6e;
  memset(__s,0,__n);
  uVar8 = (ulong)(uVar7 - 1 >> 3);
  puVar5 = __s;
  do {
    uVar2 = *(ulong *)(sk + (uVar8 & 0xffffffff) * 8);
    *puVar5 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
              | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18
              | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    puVar5 = puVar5 + 1;
    bVar9 = uVar8 != 0;
    uVar8 = uVar8 - 1;
  } while (bVar9);
  *(undefined8 *)((long)&uStack_78 + lVar1) = 0x163da1;
  pvVar6 = memcpy(pvStack_70,(void *)((long)__s + (__n - uVar7)),(ulong)uVar7);
  return (uint64_t)pvVar6;
}

Assistant:

uint64_t
Hacl_FFDHE_ffdhe_shared_secret(Spec_FFDHE_ffdhe_alg a, uint8_t *sk, uint8_t *pk, uint8_t *ss)
{
  uint32_t len = ffdhe_len(a);
  uint32_t nLen = (len - 1U) / 8U + 1U;
  KRML_CHECK_SIZE(sizeof (uint64_t), nLen + nLen);
  uint64_t p_n[nLen + nLen];
  memset(p_n, 0U, (nLen + nLen) * sizeof (uint64_t));
  ffdhe_precomp_p(a, p_n);
  uint64_t m = Hacl_FFDHE_ffdhe_shared_secret_precomp(a, p_n, sk, pk, ss);
  return m;
}